

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vision.c
# Opt level: O1

void right_side(int row,int left,int right_mark,char *limits)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint row_00;
  int iVar5;
  int iVar6;
  int right_mark_00;
  int iVar7;
  long lVar8;
  int local_88;
  char *local_80;
  char *local_70;
  char *local_68;
  char *local_58;
  
  row_00 = step + row;
  if (row_00 < 0x15) {
    if (limits == (char *)0x0) {
      bVar2 = true;
    }
    else {
      bVar2 = limits[1] <= *limits;
    }
  }
  else {
    bVar2 = false;
  }
  if (vis_func == (_func_void_int_int_void_ptr *)0x0) {
    local_68 = cs_rows[row];
    local_70 = cs_left + row;
    local_80 = cs_right + row;
  }
  else {
    local_68 = (char *)0x0;
    local_70 = (char *)0x0;
    local_80 = (char *)0x0;
  }
  if (limits == (char *)0x0) {
    local_88 = 0x4f;
    local_58 = (char *)0x0;
  }
  else {
    local_88 = 0x4f;
    if (*limits + start_col < 0x4f) {
      local_88 = *limits + start_col;
    }
    if (local_88 < right_mark) {
      right_mark = local_88;
    }
    local_58 = limits + 1;
  }
  if (left <= right_mark) {
    do {
      iVar3 = step;
      iVar4 = start_row;
      iVar7 = start_col;
      right_mark_00 = (int)right_ptrs[row][left];
      if (local_88 < right_ptrs[row][left]) {
        right_mark_00 = local_88;
      }
      pcVar1 = viz_clear_rows[row];
      if (pcVar1[left] == '\0') {
        if (right_mark < right_mark_00) {
          right_mark_00 =
               (right_mark + 1) - (uint)(viz_clear_rows[(long)row - (long)step][right_mark] == '\0')
          ;
        }
        if (vis_func == (_func_void_int_int_void_ptr *)0x0) {
          if (left <= right_mark_00) {
            memset(local_68 + left,1,(ulong)(uint)(right_mark_00 - left) + 1);
          }
          if (left < *local_70) {
            *local_70 = (char)left;
          }
          if (*local_80 < right_mark_00) {
            *local_80 = (char)right_mark_00;
          }
        }
        else if (left <= right_mark_00) {
          do {
            (*vis_func)(left,row,varg);
            left = left + 1;
          } while (right_mark_00 + 1 != left);
        }
        iVar4 = right_mark_00 + 1;
      }
      else {
        lVar8 = (long)start_col;
        if (left != start_col) {
          if (left <= right_mark_00) {
            do {
              if (iVar3 < 0) {
                iVar5 = q1_path(iVar4,iVar7,row,left);
              }
              else {
                iVar5 = q4_path(iVar4,iVar7,row,left);
              }
            } while ((iVar5 == 0) && (left = left + 1, right_mark_00 + 1 != left));
          }
          if (left != local_88 && local_88 <= left) {
            return;
          }
          if (left == local_88) {
            if (vis_func != (_func_void_int_int_void_ptr *)0x0) {
              (*vis_func)(local_88,row,varg);
              return;
            }
            local_68[local_88] = '\x01';
            if (local_88 <= *local_80) {
              return;
            }
            *local_80 = (char)local_88;
            return;
          }
          iVar4 = right_mark_00;
          if (right_mark_00 <= left) goto LAB_00282526;
        }
        iVar3 = step;
        iVar4 = start_row;
        if (right_mark < right_mark_00) {
          iVar5 = right_mark;
          do {
            if (iVar3 < 0) {
              iVar6 = q1_path(iVar4,iVar7,row,iVar5);
            }
            else {
              iVar6 = q4_path(iVar4,iVar7,row,iVar5);
            }
          } while ((iVar6 != 0) && (iVar5 = iVar5 + 1, right_mark_00 + 1 != iVar5));
          right_mark_00 = iVar5 + -1;
        }
        iVar4 = left;
        if (left <= right_mark_00) {
          if ((((left == right_mark_00) && (iVar7 < 0x4f)) && (left == iVar7)) &&
             (pcVar1[lVar8 + 1] == '\0')) {
            right_mark_00 = iVar7 + 1;
          }
          if (local_88 <= right_mark_00) {
            right_mark_00 = local_88;
          }
          if (vis_func == (_func_void_int_int_void_ptr *)0x0) {
            if (left <= right_mark_00) {
              memset(local_68 + left,1,(ulong)(uint)(right_mark_00 - left) + 1);
            }
            if (left < *local_70) {
              *local_70 = (char)left;
            }
            if (*local_80 < right_mark_00) {
              *local_80 = (char)right_mark_00;
            }
          }
          else if (left <= right_mark_00) {
            iVar7 = left;
            do {
              (*vis_func)(iVar7,row,varg);
              iVar7 = iVar7 + 1;
            } while (right_mark_00 + 1 != iVar7);
          }
          if (bVar2) {
            right_side(row_00,left,right_mark_00,local_58);
          }
          iVar4 = right_mark_00 + 1;
        }
      }
LAB_00282526:
      left = iVar4;
    } while (left <= right_mark);
  }
  return;
}

Assistant:

static void right_side(
    int row,		/* current row */
    int left,		/* first (left side) visible spot on prev row */
    int right_mark,	/* last (right side) visible spot on prev row */
    const char *limits)	/* points at range limit for current row, or NULL */
{
    int		  right;	/* right limit of "could see" */
    int		  right_edge;	/* right edge of an opening */
    int		  nrow;		/* new row (calculate once) */
    int		  deeper;	/* if TRUE, call self as needed */
    int		  result;	/* set by q?_path() */
    int  i;		/* loop counter */
    char *rowp;	/* row optimization */
    char	  *row_min;	/* left most  [used by macro set_min()] */
    char	  *row_max;	/* right most [used by macro set_max()] */
    int		  lim_max;	/* right most limit of circle */

    rowp = row_min = row_max = 0;
    nrow    = row + step;
    /*
     * Can go deeper if the row is in bounds and the next row is within
     * the circle's limit.  We tell the latter by checking to see if the next
     * limit value is the start of a new circle radius (meaning we depend
     * on the structure of circle_data[]).
     */
    deeper  = good_row(nrow) && (!limits || (*limits >= *(limits+1)));
    if (!vis_func) {
	rowp    = cs_rows[row];	/* optimization */
	row_min = &cs_left[row];
	row_max = &cs_right[row];
    }
    if (limits) {
	lim_max = start_col + *limits;
	if (lim_max > COLNO-1) lim_max = COLNO-1;
	if (right_mark > lim_max) right_mark = lim_max;
	limits++; /* prepare for next row */
    } else
	lim_max = COLNO-1;

    while (left <= right_mark) {
	right_edge = right_ptrs[row][left];
	if (right_edge > lim_max) right_edge = lim_max;

	if (!is_clear(row,left)) {
	    /*
	     * Jump to the far side of a stone wall.  We can set all
	     * the points in between as seen.
	     *
	     * If the right edge goes beyond the right mark, check to see
	     * how much we can see.
	     */
	    if (right_edge > right_mark) {
		/*
		 * If the mark on the previous row was a clear position,
		 * the odds are that we can actually see part of the wall
		 * beyond the mark on this row.  If so, then see one beyond
		 * the mark.  Otherwise don't.  This is a kludge so corners
		 * with an adjacent doorway show up.
		 */
		right_edge = is_clear(row-step,right_mark) ?
						    right_mark+1 : right_mark;
	    }
	    if (vis_func) {
		for (i = left; i <= right_edge; i++) (*vis_func)(i, row, varg);
	    } else {
		for (i = left; i <= right_edge; i++) set_cs(rowp,i);
		set_min(left);      set_max(right_edge);
	    }
	    left = right_edge + 1; /* no limit check necessary */
	    continue;
	}

	/* No checking needed if our left side is the start column. */
	if (left != start_col) {
	    /*
	     * Find the left side.  Move right until we can see it or we run
	     * into a wall.
	     */
	    for (; left <= right_edge; left++) {
		if (step < 0) {
		    result = q1_path(start_row,start_col,row,left);
		} else {
		    result = q4_path(start_row,start_col,row,left);
		}
		if (result) break;
	    }

	    /*
	     * Check for boundary conditions.  We *need* check (2) to break
	     * an infinite loop where:
	     *
	     *		left == right_edge == right_mark == lim_max.
	     *
	     */
	    if (left > lim_max) return;	/* check (1) */
	    if (left == lim_max) {	/* check (2) */
		if (vis_func) (*vis_func)(lim_max, row, varg);
		else {
		    set_cs(rowp,lim_max);
		    set_max(lim_max);
		}
		return;
	    }
	    /*
	     * Check if we can see any spots in the opening.  We might
	     * (left == right_edge) or might not (left == right_edge+1) have
	     * been able to see the far wall.  Make sure we *can* see the
	     * wall (remember, we can see the spot above/below this one)
	     * by backing up.
	     */
	    if (left >= right_edge) {
		left = right_edge;	/* for the case left == right_edge+1 */
		continue;
	    }
	}

	/*
	 * Find the right side.  If the marker from the previous row is
	 * closer than the edge on this row, then we have to check
	 * how far we can see around the corner (under the overhang).  Stop
	 * at the first non-visible spot or we actually hit the far wall.
	 *
	 * Otherwise, we know we can see the right edge of the current row.
	 *
	 * This must be a strict less than so that we can always see a
	 * horizontal wall, even if it is adjacent to us.
	 */
	if (right_mark < right_edge) {
	    for (right = right_mark; right <= right_edge; right++) {
		if (step < 0) {
		    result = q1_path(start_row,start_col,row,right);
		} else {
		    result = q4_path(start_row,start_col,row,right);
		}
		if (!result) break;
	    }
	    --right;	/* get rid of the last increment */
	}
	else
	    right = right_edge;

	/*
	 * We have the range that we want.  Set the bits.  Note that
	 * there is no else --- we no longer handle splinters.
	 */
	if (left <= right) {
	    /*
	     * An ugly special case.  If you are adjacent to a vertical wall
	     * and it has a break in it, then the right mark is set to be
	     * start_col.  We *want* to be able to see adjacent vertical
	     * walls, so we have to set it back.
	     */
	    if (left == right && left == start_col &&
			start_col < (COLNO-1) && !is_clear(row,start_col+1))
		right = start_col+1;

	    if (right > lim_max) right = lim_max;
	    /* set the bits */
	    if (vis_func)
		for (i = left; i <= right; i++) (*vis_func)(i, row, varg);
	    else {
		for (i = left; i <= right; i++) set_cs(rowp,i);
		set_min(left);      set_max(right);
	    }

	    /* recursive call for next finger of light */
	    if (deeper) right_side(nrow,left,right,limits);
	    left = right + 1; /* no limit check necessary */
	}
    }
}